

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O2

Solution * calculate_one_solution(Solution *__return_storage_ptr__,int argc,Edge *edges,int maxNode)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 uStack_50;
  int aiStack_48 [2];
  Solution *local_40;
  int local_34;
  
  local_34 = argc;
  local_40 = __return_storage_ptr__;
  lVar2 = -((ulong)(uint)maxNode * 4 + 0xf & 0xfffffffffffffff0);
  lVar3 = lVar2 + -0x48;
  uVar7 = 0;
  uVar6 = (ulong)(uint)maxNode;
  if (maxNode < 1) {
    uVar6 = uVar7;
  }
  *(undefined8 *)((long)&uStack_50 + lVar2) = 3;
  uVar1 = *(undefined8 *)((long)&uStack_50 + lVar2);
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10151b;
    iVar4 = rand();
    *(int *)((long)aiStack_48 + uVar7 * 4 + lVar3 + 0x48) = iVar4 % (int)uVar1 + 1;
  }
  *(undefined8 *)((long)&uStack_50 + lVar2) = 1;
  iVar4 = (int)*(undefined8 *)((long)&uStack_50 + lVar2);
  if (1 < local_34) {
    iVar4 = local_34;
  }
  uVar6 = 0;
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0xffffffffffffffff;
  uVar1 = *(undefined8 *)((long)&uStack_50 + lVar2);
  iVar5 = 0;
  do {
    if (iVar4 - 1 == uVar6) {
LAB_00101579:
      local_40->amount = iVar5;
      return local_40;
    }
    if (*(int *)((long)aiStack_48 + (long)edges[uVar6].start * 4 + lVar3 + 0x48) ==
        *(int *)((long)aiStack_48 + (long)edges[uVar6].end * 4 + lVar3 + 0x48)) {
      if (7 < iVar5) {
        iVar5 = (int)uVar1;
        goto LAB_00101579;
      }
      local_40->edges[iVar5] = edges[uVar6];
      iVar5 = iVar5 + 1;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

static Solution calculate_one_solution(const int argc, const Edge *edges, const int maxNode)
{
	Solution newSolution;

	int node_color[maxNode];
	for (int i = 0; i < maxNode; i++)
	{
		int num = (rand() % (3)) + 1;
		node_color[i] = num;
	}

	int NumberColorConflicts = 0;
	for (int i = 0; i < argc - 1; i++)
	{
		if (node_color[edges[i].start] == node_color[edges[i].end])
		{
			if (NumberColorConflicts >= MAXRETURN)	// if to many conflicts are found
			{
				newSolution.amount = -1;	// indicates that to many are found
				return newSolution;
			}
			newSolution.edges[NumberColorConflicts] = edges[i];
			NumberColorConflicts++;
		}
	}
	newSolution.amount = NumberColorConflicts;
	return newSolution;
}